

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O0

void __thiscall
re2::SparseArray<re2::NFA::Thread_*>::resize(SparseArray<re2::NFA::Thread_*> *this,int new_max_size)

{
  int iVar1;
  int min;
  int *piVar2;
  IndexValue *__result;
  IndexValue *this_00;
  int in_ESI;
  SparseArray<re2::NFA::Thread_*> *in_RDI;
  PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue> b;
  PODArray<int> a;
  int old_max_size;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined8 in_stack_ffffffffffffffa8;
  int iVar3;
  PODArray<int> *in_stack_ffffffffffffffb0;
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  DebugCheckInvariants(in_RDI);
  iVar1 = max_size((SparseArray<re2::NFA::Thread_*> *)
                   CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if (iVar1 < in_ESI) {
    min = max_size((SparseArray<re2::NFA::Thread_*> *)
                   CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    PODArray<int>::PODArray(in_stack_ffffffffffffffb0,iVar3);
    PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::PODArray
              ((PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue> *)
               in_stack_ffffffffffffffb0,iVar3);
    piVar2 = PODArray<int>::data((PODArray<int> *)0x24cc66);
    iVar3 = (int)((ulong)piVar2 >> 0x20);
    __result = (IndexValue *)PODArray<int>::data((PODArray<int> *)0x24cc7f);
    std::copy_n<int*,int,int*>(&in_RDI->size_,iVar3,(int *)__result);
    PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::data
              ((PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue> *)0x24cca9);
    iVar1 = min;
    this_00 = PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::data
                        ((PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue> *)0x24ccc2);
    std::
    copy_n<re2::SparseArray<re2::NFA::Thread*>::IndexValue*,int,re2::SparseArray<re2::NFA::Thread*>::IndexValue*>
              ((IndexValue *)in_RDI,iVar3,__result);
    PODArray<int>::operator=
              ((PODArray<int> *)this_00,(PODArray<int> *)CONCAT44(iVar1,in_stack_ffffffffffffff88));
    PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::operator=
              ((PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue> *)this_00,
               (PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue> *)
               CONCAT44(iVar1,in_stack_ffffffffffffff88));
    MaybeInitializeMemory(in_RDI,min,in_ESI);
    PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::~PODArray
              ((PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue> *)0x24cd22);
    PODArray<int>::~PODArray((PODArray<int> *)0x24cd2c);
  }
  if (in_ESI < in_RDI->size_) {
    in_RDI->size_ = in_ESI;
  }
  DebugCheckInvariants(in_RDI);
  return;
}

Assistant:

void SparseArray<Value>::resize(int new_max_size) {
  DebugCheckInvariants();
  if (new_max_size > max_size()) {
    const int old_max_size = max_size();

    // Construct these first for exception safety.
    PODArray<int> a(new_max_size);
    PODArray<IndexValue> b(new_max_size);

    std::copy_n(sparse_.data(), old_max_size, a.data());
    std::copy_n(dense_.data(), old_max_size, b.data());

    sparse_ = std::move(a);
    dense_ = std::move(b);

    MaybeInitializeMemory(old_max_size, new_max_size);
  }
  if (size_ > new_max_size)
    size_ = new_max_size;
  DebugCheckInvariants();
}